

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_test.cc
# Opt level: O2

void basic_test(void)

{
  uint __line;
  char *pcVar1;
  atomic<unsigned_char> counter_8;
  atomic<unsigned_short> counter_16;
  atomic<unsigned_int> counter_32;
  atomic<unsigned_long> counter_64;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  counter_64.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)200;
  atomic_incr_uint64_t(&counter_64,memory_order_seq_cst);
  if (counter_64.super___atomic_base<unsigned_long>._M_i != 0xc9) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x29);
    basic_test()::__test_pass = '\x01';
    if (counter_64.super___atomic_base<unsigned_long>._M_i != 0xc9) {
      pcVar1 = "atomic_get_uint64_t(&counter_64) == 201";
      __line = 0x29;
      goto LAB_00101bfa;
    }
  }
  atomic_decr_uint64_t(&counter_64,memory_order_seq_cst);
  if (counter_64.super___atomic_base<unsigned_long>._M_i != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x2b);
    basic_test()::__test_pass = '\x01';
    if (counter_64.super___atomic_base<unsigned_long>._M_i != 200) {
      pcVar1 = "atomic_get_uint64_t(&counter_64) == 200";
      __line = 0x2b;
      goto LAB_00101bfa;
    }
  }
  atomic_add_uint64_t(&counter_64,10,memory_order_seq_cst);
  if (counter_64.super___atomic_base<unsigned_long>._M_i != 0xd2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x2d);
    basic_test()::__test_pass = '\x01';
    if (counter_64.super___atomic_base<unsigned_long>._M_i != 0xd2) {
      pcVar1 = "atomic_get_uint64_t(&counter_64) == 210";
      __line = 0x2d;
      goto LAB_00101bfa;
    }
  }
  atomic_sub_uint64_t(&counter_64,10,memory_order_seq_cst);
  if (counter_64.super___atomic_base<unsigned_long>._M_i != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x2f);
    basic_test()::__test_pass = '\x01';
    if (counter_64.super___atomic_base<unsigned_long>._M_i != 200) {
      pcVar1 = "atomic_get_uint64_t(&counter_64) == 200";
      __line = 0x2f;
      goto LAB_00101bfa;
    }
  }
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  counter_32.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)200;
  atomic_incr_uint32_t(&counter_32,memory_order_seq_cst);
  if (counter_32.super___atomic_base<unsigned_int>._M_i != 0xc9) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x3b);
    basic_test()::__test_pass = '\x01';
    if (counter_32.super___atomic_base<unsigned_int>._M_i != 0xc9) {
      pcVar1 = "atomic_get_uint32_t(&counter_32) == 201";
      __line = 0x3b;
      goto LAB_00101bfa;
    }
  }
  atomic_decr_uint32_t(&counter_32,memory_order_seq_cst);
  if (counter_32.super___atomic_base<unsigned_int>._M_i != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x3d);
    basic_test()::__test_pass = '\x01';
    if (counter_32.super___atomic_base<unsigned_int>._M_i != 200) {
      pcVar1 = "atomic_get_uint32_t(&counter_32) == 200";
      __line = 0x3d;
      goto LAB_00101bfa;
    }
  }
  atomic_add_uint32_t(&counter_32,10,memory_order_seq_cst);
  if (counter_32.super___atomic_base<unsigned_int>._M_i != 0xd2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x3f);
    basic_test()::__test_pass = '\x01';
    if (counter_32.super___atomic_base<unsigned_int>._M_i != 0xd2) {
      pcVar1 = "atomic_get_uint32_t(&counter_32) == 210";
      __line = 0x3f;
      goto LAB_00101bfa;
    }
  }
  atomic_sub_uint32_t(&counter_32,10,memory_order_seq_cst);
  if (counter_32.super___atomic_base<unsigned_int>._M_i != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x41);
    basic_test()::__test_pass = '\x01';
    if (counter_32.super___atomic_base<unsigned_int>._M_i != 200) {
      pcVar1 = "atomic_get_uint32_t(&counter_32) == 200";
      __line = 0x41;
      goto LAB_00101bfa;
    }
  }
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  counter_16.super___atomic_base<unsigned_short>._M_i = (__atomic_base<unsigned_short>)200;
  atomic_incr_uint16_t(&counter_16,memory_order_seq_cst);
  if (counter_16.super___atomic_base<unsigned_short>._M_i != 0xc9) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x4d);
    basic_test()::__test_pass = '\x01';
    if (counter_16.super___atomic_base<unsigned_short>._M_i != 0xc9) {
      pcVar1 = "atomic_get_uint16_t(&counter_16) == 201";
      __line = 0x4d;
      goto LAB_00101bfa;
    }
  }
  atomic_decr_uint16_t(&counter_16,memory_order_seq_cst);
  if (counter_16.super___atomic_base<unsigned_short>._M_i != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x4f);
    basic_test()::__test_pass = '\x01';
    if (counter_16.super___atomic_base<unsigned_short>._M_i != 200) {
      pcVar1 = "atomic_get_uint16_t(&counter_16) == 200";
      __line = 0x4f;
      goto LAB_00101bfa;
    }
  }
  atomic_add_uint16_t(&counter_16,10,memory_order_seq_cst);
  if (counter_16.super___atomic_base<unsigned_short>._M_i != 0xd2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x51);
    basic_test()::__test_pass = '\x01';
    if (counter_16.super___atomic_base<unsigned_short>._M_i != 0xd2) {
      pcVar1 = "atomic_get_uint16_t(&counter_16) == 210";
      __line = 0x51;
      goto LAB_00101bfa;
    }
  }
  atomic_sub_uint16_t(&counter_16,10,memory_order_seq_cst);
  if (counter_16.super___atomic_base<unsigned_short>._M_i != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x53);
    basic_test()::__test_pass = '\x01';
    if (counter_16.super___atomic_base<unsigned_short>._M_i != 200) {
      pcVar1 = "atomic_get_uint16_t(&counter_16) == 200";
      __line = 0x53;
      goto LAB_00101bfa;
    }
  }
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  counter_8.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'d';
  atomic_incr_uint8_t(&counter_8,memory_order_seq_cst);
  if (counter_8.super___atomic_base<unsigned_char>._M_i != 'e') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x5f);
    basic_test()::__test_pass = '\x01';
    if (counter_8.super___atomic_base<unsigned_char>._M_i != 'e') {
      pcVar1 = "atomic_get_uint8_t(&counter_8) == 101";
      __line = 0x5f;
      goto LAB_00101bfa;
    }
  }
  atomic_decr_uint8_t(&counter_8,memory_order_seq_cst);
  if (counter_8.super___atomic_base<unsigned_char>._M_i != 'd') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x61);
    basic_test()::__test_pass = '\x01';
    if (counter_8.super___atomic_base<unsigned_char>._M_i != 'd') {
      pcVar1 = "atomic_get_uint8_t(&counter_8) == 100";
      __line = 0x61;
      goto LAB_00101bfa;
    }
  }
  atomic_add_uint8_t(&counter_8,'\n',memory_order_seq_cst);
  if (counter_8.super___atomic_base<unsigned_char>._M_i != 'n') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,99);
    basic_test()::__test_pass = '\x01';
    if (counter_8.super___atomic_base<unsigned_char>._M_i != 'n') {
      pcVar1 = "atomic_get_uint8_t(&counter_8) == 110";
      __line = 99;
      goto LAB_00101bfa;
    }
  }
  atomic_sub_uint8_t(&counter_8,'\n',memory_order_seq_cst);
  if (counter_8.super___atomic_base<unsigned_char>._M_i != 'd') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x65);
    basic_test()::__test_pass = '\x01';
    if (counter_8.super___atomic_base<unsigned_char>._M_i != 'd') {
      pcVar1 = "atomic_get_uint8_t(&counter_8) == 100";
      __line = 0x65;
LAB_00101bfa:
      basic_test()::__test_pass = 1;
      __assert_fail(pcVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,__line,"void basic_test()");
    }
  }
  pcVar1 = "%s PASSED\n";
  if (basic_test()::__test_pass != '\0') {
    pcVar1 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar1,"basic test");
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    atomic_uint64_t counter_64;
    uint64_t val_64 = 0, val_64_new = 200;
    int64_t delta_64 = 10;
    atomic_init_uint64_t(&counter_64, val_64);
    val_64 = 100;
    atomic_store_uint64_t(&counter_64, val_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 100);
    atomic_cas_uint64_t(&counter_64, val_64, val_64_new);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);
    atomic_incr_uint64_t(&counter_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 201);
    atomic_decr_uint64_t(&counter_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);
    atomic_add_uint64_t(&counter_64, delta_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 210);
    atomic_sub_uint64_t(&counter_64, delta_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);

    atomic_uint32_t counter_32;
    uint32_t val_32 = 0, val_32_new = 200;
    int32_t delta_32 = 10;
    atomic_init_uint32_t(&counter_32, val_32);
    val_32 = 100;
    atomic_store_uint32_t(&counter_32, val_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 100);
    atomic_cas_uint32_t(&counter_32, val_32, val_32_new);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);
    atomic_incr_uint32_t(&counter_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 201);
    atomic_decr_uint32_t(&counter_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);
    atomic_add_uint32_t(&counter_32, delta_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 210);
    atomic_sub_uint32_t(&counter_32, delta_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);

    atomic_uint16_t counter_16;
    uint16_t val_16 = 0, val_16_new = 200;
    int16_t delta_16 = 10;
    atomic_init_uint16_t(&counter_16, val_16);
    val_16 = 100;
    atomic_store_uint16_t(&counter_16, val_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 100);
    atomic_cas_uint16_t(&counter_16, val_16, val_16_new);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);
    atomic_incr_uint16_t(&counter_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 201);
    atomic_decr_uint16_t(&counter_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);
    atomic_add_uint16_t(&counter_16, delta_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 210);
    atomic_sub_uint16_t(&counter_16, delta_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);

    atomic_uint8_t counter_8;
    uint8_t val_8 = 0, val_8_new = 100;
    int8_t delta_8 = 10;
    atomic_init_uint8_t(&counter_8, val_8);
    val_8 = 50;
    atomic_store_uint8_t(&counter_8, val_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 50);
    atomic_cas_uint8_t(&counter_8, val_8, val_8_new);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);
    atomic_incr_uint8_t(&counter_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 101);
    atomic_decr_uint8_t(&counter_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);
    atomic_add_uint8_t(&counter_8, delta_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 110);
    atomic_sub_uint8_t(&counter_8, delta_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);

    TEST_RESULT("basic test");
}